

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowImplX11.cpp
# Opt level: O0

void __thiscall sf::priv::WindowImplX11::createHiddenCursor(WindowImplX11 *this)

{
  undefined8 uVar1;
  long in_RDI;
  XColor color;
  GC graphicsContext;
  Pixmap cursorPixmap;
  undefined1 local_28 [8];
  undefined2 local_20;
  undefined2 local_1e;
  undefined2 local_1c;
  undefined1 local_1a;
  undefined8 local_18;
  undefined8 local_10;
  
  local_10 = XCreatePixmap(*(undefined8 *)(in_RDI + 0x3d0),*(undefined8 *)(in_RDI + 0x3c8),1,1);
  local_18 = XCreateGC(*(undefined8 *)(in_RDI + 0x3d0),local_10,0);
  XDrawPoint(*(undefined8 *)(in_RDI + 0x3d0),local_10,local_18,0);
  XFreeGC(*(undefined8 *)(in_RDI + 0x3d0),local_18);
  local_1a = 7;
  local_1e = 0;
  local_1c = 0;
  local_20 = 0;
  uVar1 = XCreatePixmapCursor(*(undefined8 *)(in_RDI + 0x3d0),local_10,local_10,local_28,local_28,0,
                              0);
  *(undefined8 *)(in_RDI + 0x408) = uVar1;
  XFreePixmap(*(undefined8 *)(in_RDI + 0x3d0),local_10);
  return;
}

Assistant:

void WindowImplX11::createHiddenCursor()
{
    // Create the cursor's pixmap (1x1 pixels)
    Pixmap cursorPixmap = XCreatePixmap(m_display, m_window, 1, 1, 1);
    GC graphicsContext = XCreateGC(m_display, cursorPixmap, 0, NULL);
    XDrawPoint(m_display, cursorPixmap, graphicsContext, 0, 0);
    XFreeGC(m_display, graphicsContext);

    // Create the cursor, using the pixmap as both the shape and the mask of the cursor
    XColor color;
    color.flags = DoRed | DoGreen | DoBlue;
    color.red = color.blue = color.green = 0;
    m_hiddenCursor = XCreatePixmapCursor(m_display, cursorPixmap, cursorPixmap, &color, &color, 0, 0);

    // We don't need the pixmap any longer, free it
    XFreePixmap(m_display, cursorPixmap);
}